

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_keeper.h
# Opt level: O0

void __thiscall
mp::
ConstraintKeeper<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::NLBaseReif<1>_>
::Container::Container(Container *this,int d,NLBaseReif<1> *c)

{
  undefined4 in_ESI;
  NLBaseReif<1> *in_RDI;
  NLBaseReif<1> *in_stack_ffffffffffffffa8;
  
  NLBaseReif<1>::NLBaseReif(in_RDI,in_stack_ffffffffffffffa8);
  ExprWrapper<mp::NLBaseReif<1>_>::ExprWrapper
            ((ExprWrapper<mp::NLBaseReif<1>_> *)in_RDI,in_stack_ffffffffffffffa8);
  NLBaseReif<1>::~NLBaseReif((NLBaseReif<1> *)0x2148bb);
  *(undefined4 *)&in_RDI[1].super_BasicConstraint.name_ = in_ESI;
  Context::Context((Context *)&in_RDI[1].super_BasicConstraint.name_.field_0x4,CTX_NONE);
  *(undefined1 *)&in_RDI[1].super_BasicConstraint.name_._M_string_length = 0;
  *(undefined1 *)((long)&in_RDI[1].super_BasicConstraint.name_._M_string_length + 1) = 0;
  *(undefined1 *)((long)&in_RDI[1].super_BasicConstraint.name_._M_string_length + 2) = 0;
  return;
}

Assistant:

Container(int d, Constraint&& c) noexcept
      : con_(std::move(c)), depth_(d) { }